

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall
QBoxLayout::insertWidget(QBoxLayout *this,int index,QWidget *widget,int stretch,Alignment alignment)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  QWidgetItem *this_01;
  parameter_type t;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,widget);
  if (bVar1) {
    QLayout::addChildWidget(&this->super_QLayout,widget);
    iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
    this_01 = QLayoutPrivate::createWidgetItem(&this->super_QLayout,widget);
    QLayoutItem::setAlignment(&this_01->super_QLayoutItem,alignment);
    t = (parameter_type)operator_new(0x10);
    t->item = &this_01->super_QLayoutItem;
    t->stretch = stretch;
    t->magic = false;
    QList<QBoxLayoutItem_*>::insert(&this_00->list,(long)iVar2,t);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QBoxLayout::insertWidget(int index, QWidget *widget, int stretch,
                              Qt::Alignment alignment)
{
    Q_D(QBoxLayout);
    if (!d->checkWidget(widget))
         return;
    addChildWidget(widget);
    index = d->validateIndex(index);
    QWidgetItem *b = QLayoutPrivate::createWidgetItem(this, widget);
    b->setAlignment(alignment);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    d->list.insert(index, it);
    invalidate();
}